

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O3

int array_getfields(t_symbol *elemtemplatesym,_glist **elemtemplatecanvasp,
                   t_template **elemtemplatep,int *elemsizep,_fielddesc *xfielddesc,
                   _fielddesc *yfielddesc,_fielddesc *wfielddesc,int *xonsetp,int *yonsetp,
                   int *wonsetp)

{
  uint uVar1;
  t_template *ptVar2;
  _glist *p_Var3;
  t_symbol *ptVar4;
  uint uVar5;
  char *pcVar6;
  t_symbol **pptVar7;
  uint uVar8;
  char *fmt;
  long lVar9;
  int iVar10;
  uint uVar11;
  
  ptVar2 = (t_template *)pd_findbyclass(elemtemplatesym,template_class);
  if (ptVar2 == (t_template *)0x0) {
    pcVar6 = elemtemplatesym->s_name;
    fmt = "plot: %s: no such template";
LAB_00158983:
    pd_error((void *)0x0,fmt,pcVar6);
    iVar10 = -1;
  }
  else {
    if (elemtemplatesym == &s_float) {
      p_Var3 = (_glist *)0x0;
    }
    else if ((ptVar2->t_list == (_gtemplate *)0x0) ||
            (p_Var3 = ptVar2->t_list->x_owner, p_Var3 == (_glist *)0x0)) {
      pcVar6 = elemtemplatesym->s_name;
      fmt = "plot: %s: no canvas for this template";
      goto LAB_00158983;
    }
    uVar1 = ptVar2->t_n;
    if ((yfielddesc == (_fielddesc *)0x0) || (yfielddesc->fd_var == '\0')) {
      ptVar4 = gensym("y");
      uVar5 = ptVar2->t_n;
    }
    else {
      ptVar4 = (yfielddesc->fd_un).fd_symbol;
      uVar5 = uVar1;
    }
    uVar8 = 0xffffffff;
    if (0 < (int)uVar5) {
      pptVar7 = &ptVar2->t_vec->ds_name;
      lVar9 = 0;
      do {
        if (*pptVar7 == ptVar4) {
          uVar8 = -(uint)(((t_dataslot *)(pptVar7 + -1))->ds_type != 0) | (uint)lVar9;
          break;
        }
        pptVar7 = pptVar7 + 3;
        lVar9 = lVar9 + 8;
      } while ((ulong)uVar5 << 3 != lVar9);
    }
    if ((xfielddesc == (_fielddesc *)0x0) || (xfielddesc->fd_var == '\0')) {
      ptVar4 = gensym("x");
      uVar5 = ptVar2->t_n;
    }
    else {
      ptVar4 = (xfielddesc->fd_un).fd_symbol;
    }
    uVar11 = 0xffffffff;
    if (0 < (int)uVar5) {
      pptVar7 = &ptVar2->t_vec->ds_name;
      lVar9 = 0;
      do {
        if (*pptVar7 == ptVar4) {
          uVar11 = -(uint)(((t_dataslot *)(pptVar7 + -1))->ds_type != 0) | (uint)lVar9;
          break;
        }
        pptVar7 = pptVar7 + 3;
        lVar9 = lVar9 + 8;
      } while ((ulong)uVar5 << 3 != lVar9);
    }
    if ((wfielddesc == (_fielddesc *)0x0) || (wfielddesc->fd_var == '\0')) {
      ptVar4 = gensym("w");
      uVar5 = ptVar2->t_n;
    }
    else {
      ptVar4 = (wfielddesc->fd_un).fd_symbol;
    }
    iVar10 = -1;
    if (0 < (int)uVar5) {
      pptVar7 = &ptVar2->t_vec->ds_name;
      lVar9 = 0;
      do {
        if (*pptVar7 == ptVar4) {
          if (((t_dataslot *)(pptVar7 + -1))->ds_type == 0) {
            iVar10 = (int)lVar9;
          }
          break;
        }
        pptVar7 = pptVar7 + 3;
        lVar9 = lVar9 + 8;
      } while ((ulong)uVar5 << 3 != lVar9);
    }
    *elemtemplatecanvasp = p_Var3;
    *elemtemplatep = ptVar2;
    *elemsizep = uVar1 << 3;
    *xonsetp = uVar11;
    *yonsetp = uVar8;
    *wonsetp = iVar10;
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

int array_getfields(t_symbol *elemtemplatesym,
    t_canvas **elemtemplatecanvasp,
    t_template **elemtemplatep, int *elemsizep,
    t_fielddesc *xfielddesc, t_fielddesc *yfielddesc, t_fielddesc *wfielddesc,
    int *xonsetp, int *yonsetp, int *wonsetp)
{
    int arrayonset, elemsize, yonset, wonset, xonset, type;
    t_template *elemtemplate;
    t_symbol *dummy, *varname;
    t_canvas *elemtemplatecanvas = 0;

        /* the "float" template is special in not having to have a canvas;
        template_findbyname is hardwired to return a predefined
        template. */

    if (!(elemtemplate =  template_findbyname(elemtemplatesym)))
    {
        pd_error(0, "plot: %s: no such template", elemtemplatesym->s_name);
        return (-1);
    }
    if (!((elemtemplatesym == &s_float) ||
        (elemtemplatecanvas = template_findcanvas(elemtemplate))))
    {
        pd_error(0, "plot: %s: no canvas for this template", elemtemplatesym->s_name);
        return (-1);
    }
    elemsize = elemtemplate->t_n * sizeof(t_word);
    if (yfielddesc && yfielddesc->fd_var)
        varname = yfielddesc->fd_un.fd_varsym;
    else varname = gensym("y");
    if (!template_find_field(elemtemplate, varname, &yonset, &type, &dummy)
        || type != DT_FLOAT)
            yonset = -1;
    if (xfielddesc && xfielddesc->fd_var)
        varname = xfielddesc->fd_un.fd_varsym;
    else varname = gensym("x");
    if (!template_find_field(elemtemplate, varname, &xonset, &type, &dummy)
        || type != DT_FLOAT)
            xonset = -1;
    if (wfielddesc && wfielddesc->fd_var)
        varname = wfielddesc->fd_un.fd_varsym;
    else varname = gensym("w");
    if (!template_find_field(elemtemplate, varname, &wonset, &type, &dummy)
        || type != DT_FLOAT)
            wonset = -1;

        /* fill in slots for return values */
    *elemtemplatecanvasp = elemtemplatecanvas;
    *elemtemplatep = elemtemplate;
    *elemsizep = elemsize;
    *xonsetp = xonset;
    *yonsetp = yonset;
    *wonsetp = wonset;
    return (0);
}